

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reduce.cpp
# Opt level: O2

void __thiscall tst_helpers_reduce::sequenceTypes(tst_helpers_reduce *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  bool bVar3;
  char cVar4;
  PromiseData<int> *pPVar5;
  PromiseResolver<int> *pPVar6;
  PromiseData<int> *pPVar7;
  Data *pDVar8;
  _List_node_base *p_Var9;
  pointer pQVar10;
  long lVar11;
  int iVar12;
  QPromiseReject<int> *in_R8;
  char *reject;
  undefined1 *puVar13;
  initializer_list<QtPromise::QPromise<int>_> __l;
  initializer_list<int> args;
  initializer_list<int> args_00;
  initializer_list<QtPromise::QPromise<int>_> __l_00;
  initializer_list<int> args_01;
  initializer_list<int> args_02;
  Type p1;
  anon_class_48_4_6432c65f local_2c8;
  undefined1 *local_290;
  undefined1 local_288 [40];
  undefined **local_260;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> local_258;
  int local_250;
  Type p1_1;
  QPromise<int> input_2;
  QPromiseBase<int> local_228;
  PromiseResolver<int> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> local_210;
  Type p0;
  PromiseResolver<int> resolver_3;
  PromiseResolver<int> resolver_1;
  QPromiseBase<int> local_1e0;
  pointer local_1d0;
  QPromiseBase<int> local_1c8;
  PromiseResolver<int> resolver;
  QPromise<int> input_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_180;
  list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> inputs;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_158;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_150;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_148;
  vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> inputs_1;
  QVector<int> v1;
  QVector<int> v0;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_e8;
  _Any_data local_c8;
  _Manager_type local_b8;
  _Invoker_type p_Stack_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  pointer local_80;
  int local_74;
  QPromise<int> input;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_50;
  
  anon_unknown.dwarf_45086::SequenceTester<QList<QtPromise::QPromise<int>_>_>::exec();
  anon_unknown.dwarf_45086::SequenceTester<QList<QtPromise::QPromise<int>_>_>::exec();
  local_e8.super__Function_base._M_functor._0_4_ = 4;
  QtPromise::resolve<int>((QtPromise *)&local_2c8,(int *)&local_e8);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            ((QPromiseBase<int> *)local_288,(anon_class_4_1_898ef5c2)(int)&local_2c8);
  local_c8._0_4_ = 6;
  QtPromise::resolve<int>((QtPromise *)&v0,(int *)local_c8._M_pod_data);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            ((QPromiseBase<int> *)(local_288 + 0x10),(anon_class_4_1_898ef5c2)(int)&v0);
  input.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(input.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,8);
  QtPromise::resolve<int>((QtPromise *)&v1,(int *)&input);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            ((QPromiseBase<int> *)(local_288 + 0x20),(anon_class_4_1_898ef5c2)(int)&v1);
  __l._M_len = 3;
  __l._M_array = (iterator)local_288;
  std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::list
            (&inputs,__l,(allocator_type *)local_a8._M_pod_data);
  lVar11 = 0x20;
  do {
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)(local_288 + lVar11));
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != -0x10);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&v1);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&v0);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_2c8);
  p_Var9 = inputs.
           super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  v0.d.size = 0;
  v0.d.d = (Data *)0x0;
  v0.d.ptr = (int *)0x0;
  v1.d.size = 0;
  v1.d.d = (Data *)0x0;
  v1.d.ptr = (int *)0x0;
  p0.super_QPromiseBase<int>.m_d.d =
       (PromiseData<int> *)
       inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
       ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
  if (p0.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
    p0.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  }
  else {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8._M_unused._M_object = &PTR__QPromiseBase_00134920;
  local_c8._8_8_ = (PromiseData<int> *)0x0;
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_c8);
  iVar12 = 1;
  while (p_Var9 = (((_List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
                     *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var9 != (_List_node_base *)&inputs) {
    input.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)p_Var9[1]._M_prev;
    if (input.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
      input.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    }
    else {
      LOCK();
      pQVar1 = &((input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    inputs_1.
    super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)&PTR__QPromiseBase_00134920;
    inputs_1.
    super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    input.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&inputs_1);
    local_2c8.input.super_QPromiseBase<int>.m_d.d = input.super_QPromiseBase<int>.m_d.d;
    if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_2c8.fn.called = (bool *)&v0;
    local_2c8.promise.super_QPromiseBase<int>.m_d.d = p0.super_QPromiseBase<int>.m_d.d;
    if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2c8.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    input_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001348c0;
    local_2c8.idx = iVar12;
    pPVar5 = (PromiseData<int> *)operator_new(0x68);
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<int>::PromiseData(pPVar5);
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar5 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00134920;
    input_1.super_QPromiseBase<int>.m_d.d = pPVar5;
    local_e8.super__Function_base._M_functor._8_8_ = pPVar5;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_e8);
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_e8);
    QVar2 = p0.super_QPromiseBase<int>.m_d;
    if (resolver.m_d.d == (Data *)0x0) {
      local_288._0_8_ = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      local_288._0_8_ = resolver;
    }
    p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    if ((Data *)local_288._0_8_ == (Data *)0x0) {
      local_288._8_8_ = (Data *)0x0;
    }
    else {
      LOCK();
      (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_288._8_8_ = local_288._0_8_;
    }
    local_228._vptr_QPromiseBase = (_func_int **)0x0;
    if ((Data *)local_288._0_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((Data *)local_288._8_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_288._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_288._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_288._24_8_ = local_2c8.input.super_QPromiseBase<int>.m_d.d;
    if (local_2c8.input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_2c8.input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_288._16_8_ = &PTR__QPromiseBase_00134920;
    local_288._32_8_ = local_2c8.fn.called;
    local_258.d = local_2c8.promise.super_QPromiseBase<int>.m_d.d;
    if (local_2c8.promise.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_2c8.promise.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_260 = &PTR__QPromiseBase_00134920;
    local_250 = local_2c8.idx;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_98 = (code *)0x0;
    pcStack_90 = (code *)0x0;
    input_2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_288._0_8_;
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_288._8_8_
    ;
    pPVar6 = (PromiseResolver<int> *)operator_new(0x40);
    pPVar6->m_d = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
                  local_288._0_8_;
    if ((Data *)local_288._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_288._0_8_ = (int)*(QAtomicInt *)local_288._0_8_ + 1;
      UNLOCK();
    }
    pPVar6[1].m_d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_288._8_8_
    ;
    if ((PromiseData<int> *)local_288._8_8_ != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &((PromiseDataBase<int,_void_(const_int_&)> *)local_288._8_8_)->_vptr_PromiseDataBase)->
      super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i = (((QAtomicInt *)
              &((PromiseDataBase<int,_void_(const_int_&)> *)local_288._8_8_)->_vptr_PromiseDataBase)
             ->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    _lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_265_32_
              ((anon_class_48_4_6432c65f_conflict *)(pPVar6 + 2),
               (anon_class_48_4_6432c65f_conflict *)(local_288 + 0x10));
    pcStack_90 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    local_a8._M_unused._0_8_ = (undefined8)pPVar6;
    anon_func::anon_class_64_3_a63a5800::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromise_p_h_270_16_
              ((anon_class_64_3_a63a5800 *)local_288);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_int_&)> *)&local_a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_a8);
    QVar2 = p0.super_QPromiseBase<int>.m_d;
    QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              (&local_50,(PromiseCatcher<int,decltype(nullptr),void> *)0x0,&input_2,
               (QPromiseResolve<int> *)&resolver_2,in_R8);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_2.m_d);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
               &local_228);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
               &input_2);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&p1);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver.m_d);
    input_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p0.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
                );
    }
    QtPromise::QPromiseBase<int>::operator=
              (&p0.super_QPromiseBase<int>,&input_1.super_QPromiseBase<int>);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&input_1.super_QPromiseBase<int>);
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_265_32_
              (&local_2c8);
    iVar12 = iVar12 + 1;
    QtPromise::QPromiseBase<int>::~QPromiseBase(&input.super_QPromiseBase<int>);
  }
  local_180.d._0_4_ = 2;
  QtPromise::resolve<int>((QtPromise *)&local_228,(int *)&local_180);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            ((QPromiseBase<int> *)&resolver_2,(anon_class_4_1_898ef5c2)(int)&local_228);
  inputs_1.super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__QPromiseBase_00134920;
  p1.super_QPromiseBase<int>.m_d.d = local_210.d;
  inputs_1.super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&inputs_1);
  pQVar10 = (pointer)0x0;
  local_290 = local_288 + 0x10;
  p_Var9 = (_List_node_base *)&inputs;
  while (p_Var9 = (((_List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
                     *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var9 != (_List_node_base *)&inputs) {
    input_1.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)p_Var9[1]._M_prev;
    if (input_1.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
      input_1.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    }
    else {
      LOCK();
      pQVar1 = &((input_1.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
         &PTR__QPromiseBase_00134920;
    input_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver);
    local_2c8.input.super_QPromiseBase<int>.m_d.d = input_1.super_QPromiseBase<int>.m_d.d;
    if (input_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((input_1.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_2c8.fn.called = (bool *)&v1;
    local_2c8.promise.super_QPromiseBase<int>.m_d.d = p1.super_QPromiseBase<int>.m_d.d;
    if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2c8.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_2c8.idx = (int)pQVar10;
    input_2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001348c0;
    pPVar5 = (PromiseData<int> *)operator_new(0x68);
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (pPVar5->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<int>::PromiseData(pPVar5);
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar5 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00134920;
    input_2.super_QPromiseBase<int>.m_d.d = pPVar5;
    local_e8.super__Function_base._M_functor._8_8_ = pPVar5;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&local_e8);
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_e8);
    QVar2 = p1.super_QPromiseBase<int>.m_d;
    if (resolver_1.m_d.d == (Data *)0x0) {
      local_288._0_8_ = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      local_288._0_8_ = resolver_1;
    }
    local_1e0._vptr_QPromiseBase = (_func_int **)0x0;
    if ((Data *)local_288._0_8_ == (Data *)0x0) {
      local_288._8_8_ = (PromiseData<int> *)0x0;
    }
    else {
      LOCK();
      (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_288._8_8_ = local_288._0_8_;
    }
    resolver_3.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
    if ((Data *)local_288._0_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((PromiseData<int> *)local_288._8_8_ != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &(((PromiseData<int> *)local_288._8_8_)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (((QAtomicInt *)
            &(((PromiseData<int> *)local_288._8_8_)->super_PromiseDataBase<int,_void_(const_int_&)>)
             ._vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_288._24_8_ = local_2c8.input.super_QPromiseBase<int>.m_d.d;
    if (local_2c8.input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_2c8.input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_288._16_8_ = &PTR__QPromiseBase_00134920;
    local_288._32_8_ = local_2c8.fn.called;
    local_258.d = local_2c8.promise.super_QPromiseBase<int>.m_d.d;
    if (local_2c8.promise.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_2c8.promise.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_260 = &PTR__QPromiseBase_00134920;
    local_250 = local_2c8.idx;
    local_c8._M_unused._M_object = (_func_int **)0x0;
    local_c8._8_8_ = (PromiseData<int> *)0x0;
    local_b8 = (_Manager_type)0x0;
    p_Stack_b0 = (_Invoker_type)0x0;
    p1_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_288._0_8_;
    local_1d0 = pQVar10;
    local_1c8._vptr_QPromiseBase = (_func_int **)local_288._8_8_;
    pPVar6 = (PromiseResolver<int> *)operator_new(0x40);
    pPVar6->m_d = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
                  local_288._0_8_;
    if ((Data *)local_288._0_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_288._0_8_ = (int)*(QAtomicInt *)local_288._0_8_ + 1;
      UNLOCK();
    }
    pPVar6[1].m_d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_288._8_8_
    ;
    if ((PromiseData<int> *)local_288._8_8_ != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &((PromiseDataBase<int,_void_(const_int_&)> *)local_288._8_8_)->_vptr_PromiseDataBase)->
      super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i = (((QAtomicInt *)
              &((PromiseDataBase<int,_void_(const_int_&)> *)local_288._8_8_)->_vptr_PromiseDataBase)
             ->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    _lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_234_32_
              ((anon_class_48_4_6432c65f_conflict1 *)(pPVar6 + 2),
               (anon_class_48_4_6432c65f_conflict1 *)(local_288 + 0x10));
    p_Stack_b0 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    local_c8._M_unused._0_8_ = (undefined8)pPVar6;
    anon_func::anon_class_64_3_a63a5800::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromise_p_h_270_16_
              ((anon_class_64_3_a63a5800 *)local_288);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_int_&)> *)&local_c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    QVar2 = p1.super_QPromiseBase<int>.m_d;
    QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&input,
               (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&p1_1,
               (QPromiseResolve<int> *)&local_1c8,in_R8);
    pQVar10 = local_1d0;
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&input);
    std::_Function_base::~_Function_base((_Function_base *)&input);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
               &local_1c8);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_3.m_d);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&p1_1);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
               &local_1e0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_1.m_d);
    input_2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p1.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
                );
    }
    QtPromise::QPromiseBase<int>::operator=
              (&p1.super_QPromiseBase<int>,&input_2.super_QPromiseBase<int>);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&input_2.super_QPromiseBase<int>);
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_234_32_
              (&local_2c8);
    pQVar10 = (pointer)(ulong)((int)pQVar10 + 1);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&input_1.super_QPromiseBase<int>);
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver_2);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_228);
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p0.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_288[0] = bVar3;
  local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 1;
  reject = 
  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
  ;
  bVar3 = QTest::qCompare<bool,bool>
                    ((bool *)local_288,(bool *)&local_2c8,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                     ,0x3d);
  if (bVar3) {
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p1.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    local_288[0] = bVar3;
    local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 1;
    reject = 
    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
    ;
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)local_288,(bool *)&local_2c8,"p1.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                       ,0x3e);
    if (bVar3) {
      local_288._0_4_ = 0xffffffff;
      iVar12 = waitForValue<int>(&p0,(int *)local_288);
      reject = 
      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
      ;
      cVar4 = QTest::qCompare(iVar12,0x15,"waitForValue(p0, -1)","21",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                              ,0x3f);
      if (cVar4 != '\0') {
        local_288._0_4_ = 0xffffffff;
        iVar12 = waitForValue<int>(&p1,(int *)local_288);
        reject = 
        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
        ;
        cVar4 = QTest::qCompare(iVar12,0x17,"waitForValue(p1, -1)","23",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                                ,0x40);
        if (cVar4 != '\0') {
          local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 4;
          local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_ = 0x6000000;
          local_2c8.input.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0xb00000001;
          local_2c8.fn.called = (bool *)0x200000008;
          args._M_len = 6;
          args._M_array = (iterator)&local_2c8;
          QList<int>::QList((QList<int> *)local_288,args);
          reject = 
          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
          ;
          bVar3 = QTest::qCompare<int>
                            (&v0,(QList<int> *)local_288,"v0","(QVector<int>{4, 6, 1, 11, 8, 2})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                             ,0x41);
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)local_288);
          if (bVar3) {
            local_288._16_8_ = (_func_int **)0x100000006;
            local_288._24_8_ = (PromiseData<int> *)0x80000000d;
            local_288._0_8_ = (_List_node_base *)0x400000002;
            local_288._8_8_ = (PromiseData<int> *)0x600000000;
            local_288._32_4_ = 2;
            args_00._M_len = 9;
            args_00._M_array = (iterator)local_288;
            QList<int>::QList((QList<int> *)&local_2c8,args_00);
            reject = 
            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
            ;
            QTest::qCompare<int>
                      (&v1,(QList<int> *)&local_2c8,"v1",
                       "(QVector<int>{2, 4, 0, 6, 6, 1, 13, 8, 2})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                       ,0x42);
            QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_2c8);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p0.super_QPromiseBase<int>);
  QArrayDataPointer<int>::~QArrayDataPointer(&v1.d);
  QArrayDataPointer<int>::~QArrayDataPointer(&v0.d);
  std::__cxx11::_List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::
  _M_clear(&inputs.
            super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>);
  v1.d.d = (Data *)CONCAT44(v1.d.d._4_4_,4);
  QtPromise::resolve<int>((QtPromise *)&local_2c8,(int *)&v1);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            ((QPromiseBase<int> *)local_288,(anon_class_4_1_898ef5c2)(int)&local_2c8);
  local_e8.super__Function_base._M_functor._0_4_ = 6;
  QtPromise::resolve<int>((QtPromise *)&inputs,(int *)&local_e8);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            ((QPromiseBase<int> *)(local_288 + 0x10),(anon_class_4_1_898ef5c2)(int)&inputs);
  input_1.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(input_1.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,8);
  QtPromise::resolve<int>((QtPromise *)&v0,(int *)&input_1);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            ((QPromiseBase<int> *)(local_288 + 0x20),(anon_class_4_1_898ef5c2)(int)&v0);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_288;
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::vector
            (&inputs_1,__l_00,(allocator_type *)&resolver);
  lVar11 = 0x20;
  do {
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)(local_288 + lVar11));
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != -0x10);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&v0);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&inputs);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_2c8);
  pQVar10 = inputs_1.
            super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  input_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  input_1.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  pPVar5 = ((inputs_1.
             super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->super_QPromiseBase<int>).m_d.d;
  if (pPVar5 == (PromiseData<int> *)0x0) {
    pPVar5 = (PromiseData<int> *)0x0;
  }
  else {
    LOCK();
    pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  v0.d.d = (Data *)&PTR__QPromiseBase_00134920;
  v0.d.ptr = (int *)0x0;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_00134920;
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&v0);
  iVar12 = 1;
  while (pQVar10 + 1 !=
         inputs_1.
         super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
    input_2.super_QPromiseBase<int>.m_d.d = pQVar10[1].super_QPromiseBase<int>.m_d.d;
    if (input_2.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
      input_2.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    }
    else {
      LOCK();
      pQVar1 = &((input_2.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    p0.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    input_2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    local_1d0 = pQVar10 + 1;
    QtPromise::QPromiseBase<int>::~QPromiseBase(&p0.super_QPromiseBase<int>);
    local_2c8.input.super_QPromiseBase<int>.m_d.d = input_2.super_QPromiseBase<int>.m_d.d;
    if (input_2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((input_2.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 0x20;
    local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_ = 0x1349;
    local_2c8.fn.called = (bool *)&input_1;
    if (pPVar5 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2c8.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001348c0;
    local_2c8.promise.super_QPromiseBase<int>.m_d.d = pPVar5;
    local_2c8.idx = iVar12;
    pPVar7 = (PromiseData<int> *)operator_new(0x68);
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar7->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)&(pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (pPVar7->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<int>::PromiseData(pPVar7);
    LOCK();
    pQVar1 = &(pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar7 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&PTR__QPromiseBase_00134920;
    p1.super_QPromiseBase<int>.m_d.d = pPVar7;
    inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pPVar7;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver
              ((PromiseResolver<int> *)&resolver_2.m_d,(QPromise<int> *)&inputs);
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&inputs);
    if (resolver_2.m_d.d == (Data *)0x0) {
      local_288._0_8_ = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
      UNLOCK();
      local_288._0_8_ = resolver_2;
    }
    p1_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    if ((Data *)local_288._0_8_ == (Data *)0x0) {
      local_288._8_8_ = (PromiseData<int> *)0x0;
    }
    else {
      LOCK();
      (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_288._8_8_ = local_288._0_8_;
    }
    local_1c8._vptr_QPromiseBase = (_func_int **)0x0;
    if ((Data *)local_288._0_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((PromiseData<int> *)local_288._8_8_ != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &(((PromiseData<int> *)local_288._8_8_)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (((QAtomicInt *)
            &(((PromiseData<int> *)local_288._8_8_)->super_PromiseDataBase<int,_void_(const_int_&)>)
             ._vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_290 = (undefined1 *)CONCAT44(local_290._4_4_,iVar12);
    local_288._24_8_ = local_2c8.input.super_QPromiseBase<int>.m_d.d;
    if (local_2c8.input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_2c8.input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_288._16_8_ = &PTR__QPromiseBase_00134920;
    local_288._32_8_ = local_2c8.fn.called;
    local_258.d = local_2c8.promise.super_QPromiseBase<int>.m_d.d;
    if (local_2c8.promise.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_2c8.promise.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_260 = &PTR__QPromiseBase_00134920;
    local_250 = local_2c8.idx;
    v1.d.d = (Data *)0x0;
    v1.d.ptr = (int *)0x0;
    v1.d.size = 0;
    local_228._vptr_QPromiseBase = (_func_int **)local_288._0_8_;
    local_1e0._vptr_QPromiseBase = (_func_int **)local_288._8_8_;
    pDVar8 = (Data *)operator_new(0x40);
    (pDVar8->super_QArrayData).ref_ = (QBasicAtomicInt)local_288._0_4_;
    (pDVar8->super_QArrayData).flags = (ArrayOptions)local_288._4_4_;
    if ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_288._0_8_
        != (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      LOCK();
      (((QSharedData *)local_288._0_8_)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)local_288._0_8_)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (pDVar8->super_QArrayData).alloc = local_288._8_8_;
    if ((PromiseData<int> *)local_288._8_8_ != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &((PromiseDataBase<int,_void_(const_int_&)> *)local_288._8_8_)->_vptr_PromiseDataBase)->
      super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i = (((QAtomicInt *)
              &((PromiseDataBase<int,_void_(const_int_&)> *)local_288._8_8_)->_vptr_PromiseDataBase)
             ->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    _lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_265_32_
              ((anon_class_48_4_6432c65f_conflict *)(pDVar8 + 1),
               (anon_class_48_4_6432c65f_conflict *)(local_288 + 0x10));
    v1.d.size = (qsizetype)
                std::
                _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                ::_M_manager;
    v1.d.d = pDVar8;
    anon_func::anon_class_64_3_a63a5800::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromise_p_h_270_16_
              ((anon_class_64_3_a63a5800 *)local_288);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_int_&)> *)&v1);
    std::_Function_base::~_Function_base((_Function_base *)&v1);
    QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              (&local_e8,(PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_228,
               (QPromiseResolve<int> *)&local_1e0,(QPromiseReject<int> *)reject);
    iVar12 = (int)local_290;
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>,&local_e8);
    std::_Function_base::~_Function_base(&local_e8.super__Function_base);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
               &local_1e0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
               &local_1c8);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
               &local_228);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&p1_1);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_2.m_d);
    p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>);
    }
    QtPromise::QPromiseBase<int>::operator=
              ((QPromiseBase<int> *)&resolver_1,&p1.super_QPromiseBase<int>);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&p1.super_QPromiseBase<int>);
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_265_32_
              (&local_2c8);
    iVar12 = iVar12 + 1;
    QtPromise::QPromiseBase<int>::~QPromiseBase(&input_2.super_QPromiseBase<int>);
    pQVar10 = local_1d0;
  }
  local_74 = 2;
  QtPromise::resolve<int>((QtPromise *)&local_1c8,&local_74);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&local_1e0,(anon_class_4_1_898ef5c2)(int)&local_1c8);
  p1_1.super_QPromiseBase<int>.m_d.d = local_1e0.m_d.d;
  local_1e0.m_d.d = (PromiseData<int> *)0x0;
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
  p0.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  p1_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p0.super_QPromiseBase<int>);
  local_80 = inputs_1.
             super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  puVar13 = (undefined1 *)0x0;
  pQVar10 = inputs_1.
            super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (pQVar10 != local_80) {
    p1.super_QPromiseBase<int>.m_d.d = (pQVar10->super_QPromiseBase<int>).m_d.d;
    if (p1.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
      p1.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    }
    else {
      LOCK();
      pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    resolver_2.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
         &PTR__QPromiseBase_00134920;
    p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    local_1d0 = pQVar10;
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver_2);
    local_2c8.input.super_QPromiseBase<int>.m_d.d = p1.super_QPromiseBase<int>.m_d.d;
    if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 0x20;
    local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_ = 0x1349;
    local_2c8.fn.called = (bool *)&resolver;
    local_2c8.promise.super_QPromiseBase<int>.m_d.d = p1_1.super_QPromiseBase<int>.m_d.d;
    if (p1_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p1_1.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2c8.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_2c8.idx = (int)puVar13;
    local_228._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001348c0;
    pPVar7 = (PromiseData<int> *)operator_new(0x68);
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar7->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)&(pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (pPVar7->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<int>::PromiseData(pPVar7);
    LOCK();
    pQVar1 = &(pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar7 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar7->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    input_2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    input_2.super_QPromiseBase<int>.m_d.d = pPVar7;
    local_228.m_d.d = pPVar7;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver
              ((PromiseResolver<int> *)&resolver_3.m_d,
               (QPromise<int> *)&input_2.super_QPromiseBase<int>);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&input_2.super_QPromiseBase<int>);
    QVar2 = p1_1.super_QPromiseBase<int>.m_d;
    if (resolver_3.m_d.d == (Data *)0x0) {
      local_288._0_8_ = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
      UNLOCK();
      local_288._0_8_ = resolver_3;
    }
    local_148.d = (Data *)0x0;
    if ((Data *)local_288._0_8_ == (Data *)0x0) {
      local_288._8_8_ = (PromiseData<int> *)0x0;
    }
    else {
      LOCK();
      (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_288._8_8_ = local_288._0_8_;
    }
    local_158.d = (Data *)0x0;
    if ((Data *)local_288._0_8_ != (Data *)0x0) {
      LOCK();
      (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_288._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((PromiseData<int> *)local_288._8_8_ != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &(((PromiseData<int> *)local_288._8_8_)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (((QAtomicInt *)
            &(((PromiseData<int> *)local_288._8_8_)->super_PromiseDataBase<int,_void_(const_int_&)>)
             ._vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_288._24_8_ = local_2c8.input.super_QPromiseBase<int>.m_d.d;
    if (local_2c8.input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_2c8.input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_288._16_8_ = &PTR__QPromiseBase_00134920;
    local_288._32_8_ = local_2c8.fn.called;
    local_258.d = local_2c8.promise.super_QPromiseBase<int>.m_d.d;
    if (local_2c8.promise.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_2c8.promise.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_260 = &PTR__QPromiseBase_00134920;
    local_250 = local_2c8.idx;
    inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
    _M_impl._M_node._M_size = 0;
    local_290 = puVar13;
    local_180.d = (Data *)local_288._0_8_;
    local_150.d = (Data *)local_288._8_8_;
    p_Var9 = (_List_node_base *)operator_new(0x40);
    p_Var9->_M_next = (_List_node_base *)local_288._0_8_;
    if ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_288._0_8_
        != (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      LOCK();
      (((QSharedData *)local_288._0_8_)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)local_288._0_8_)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    p_Var9->_M_prev = (_List_node_base *)local_288._8_8_;
    if ((PromiseData<int> *)local_288._8_8_ != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &((PromiseDataBase<int,_void_(const_int_&)> *)local_288._8_8_)->_vptr_PromiseDataBase)->
      super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i = (((QAtomicInt *)
              &((PromiseDataBase<int,_void_(const_int_&)> *)local_288._8_8_)->_vptr_PromiseDataBase)
             ->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    _lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_234_32_
              ((anon_class_48_4_6432c65f_conflict1 *)(p_Var9 + 1),
               (anon_class_48_4_6432c65f_conflict1 *)(local_288 + 0x10));
    inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
    _M_impl._M_node._M_size =
         (size_t)std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_manager;
    inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
    _M_impl._M_node.super__List_node_base._M_next = p_Var9;
    anon_func::anon_class_64_3_a63a5800::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromise_p_h_270_16_
              ((anon_class_64_3_a63a5800 *)local_288);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_int_&)> *)&inputs);
    std::_Function_base::~_Function_base((_Function_base *)&inputs);
    QVar2 = p1_1.super_QPromiseBase<int>.m_d;
    QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&v0,
               (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_180,
               (QPromiseResolve<int> *)&local_150,(QPromiseReject<int> *)reject);
    puVar13 = local_290;
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&v0);
    std::_Function_base::~_Function_base((_Function_base *)&v0);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_150);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_158);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_180);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_148);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_3.m_d);
    local_228._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p1_1.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(p1_1.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>);
    }
    QtPromise::QPromiseBase<int>::operator=(&p1_1.super_QPromiseBase<int>,&local_228);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&local_228);
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_234_32_
              (&local_2c8);
    puVar13 = (undefined1 *)(ulong)((int)puVar13 + 1);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&p1.super_QPromiseBase<int>);
    pQVar10 = local_1d0 + 1;
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_1e0);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_1c8);
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&pPVar5->super_PromiseDataBase<int,_void_(const_int_&)>);
  local_288[0] = bVar3;
  local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 1;
  bVar3 = QTest::qCompare<bool,bool>
                    ((bool *)local_288,(bool *)&local_2c8,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                     ,0x3d);
  if (bVar3) {
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p1_1.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    local_288[0] = bVar3;
    local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 1;
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)local_288,(bool *)&local_2c8,"p1.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                       ,0x3e);
    if (bVar3) {
      local_288._0_4_ = 0xffffffff;
      iVar12 = waitForValue<int>((QPromise<int> *)&resolver_1,(int *)local_288);
      cVar4 = QTest::qCompare(iVar12,0x15,"waitForValue(p0, -1)","21",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                              ,0x3f);
      if (cVar4 != '\0') {
        local_288._0_4_ = 0xffffffff;
        iVar12 = waitForValue<int>(&p1_1,(int *)local_288);
        cVar4 = QTest::qCompare(iVar12,0x17,"waitForValue(p1, -1)","23",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                                ,0x40);
        if (cVar4 != '\0') {
          local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 4;
          local_2c8.input.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_ = 0x6000000;
          local_2c8.input.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0xb00000001;
          local_2c8.fn.called = (bool *)0x200000008;
          args_01._M_len = 6;
          args_01._M_array = (iterator)&local_2c8;
          QList<int>::QList((QList<int> *)local_288,args_01);
          bVar3 = QTest::qCompare<int>
                            ((QList<int> *)&input_1,(QList<int> *)local_288,"v0",
                             "(QVector<int>{4, 6, 1, 11, 8, 2})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                             ,0x41);
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)local_288);
          if (bVar3) {
            local_288._16_8_ = (_func_int **)0x100000006;
            local_288._24_8_ = (PromiseData<int> *)0x80000000d;
            local_288._0_8_ = (Data *)0x400000002;
            local_288._8_8_ = (PromiseData<int> *)0x600000000;
            local_288._32_4_ = 2;
            args_02._M_len = 9;
            args_02._M_array = (iterator)local_288;
            QList<int>::QList((QList<int> *)&local_2c8,args_02);
            QTest::qCompare<int>
                      ((QList<int> *)&resolver,(QList<int> *)&local_2c8,"v1",
                       "(QVector<int>{2, 4, 0, 6, 6, 1, 13, 8, 2})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                       ,0x42);
            QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_2c8);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p1_1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver_1);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&resolver);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&input_1);
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::~vector
            (&inputs_1);
  return;
}

Assistant:

void tst_helpers_reduce::sequenceTypes()
{
#if (QT_VERSION < QT_VERSION_CHECK(5, 15, 0))
    // QLinkedList is deprecated since Qt 5.15.
    SequenceTester<QLinkedList<QtPromise::QPromise<int>>>::exec();
#endif
    SequenceTester<QList<QtPromise::QPromise<int>>>::exec();
    SequenceTester<QVector<QtPromise::QPromise<int>>>::exec();
    SequenceTester<std::list<QtPromise::QPromise<int>>>::exec();
    SequenceTester<std::vector<QtPromise::QPromise<int>>>::exec();
}